

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_inlines_b.h
# Opt level: O1

void arena_dalloc_no_tcache(tsdn_t *tsdn,void *ptr)

{
  rtree_ctx_cache_elm_t *prVar1;
  ulong *puVar2;
  rtree_leaf_elm_t *prVar3;
  rtree_leaf_elm_t *prVar4;
  ulong uVar5;
  rtree_leaf_elm_t *prVar6;
  rtree_leaf_elm_t *extraout_RDX;
  ulong uVar7;
  rtree_ctx_cache_elm_t *prVar8;
  rtree_ctx_cache_elm_t *prVar9;
  rtree_ctx_t *rtree_ctx;
  bool bVar10;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_ctx_t rStack_198;
  
  rtree_ctx = &rStack_198;
  if (tsdn == (tsdn_t *)0x0) {
    duckdb_je_rtree_ctx_data_init(&rStack_198);
  }
  else {
    rtree_ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  prVar4 = (rtree_leaf_elm_t *)((ulong)ptr & 0xffffffffc0000000);
  uVar5 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  puVar2 = (ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar5);
  prVar6 = *(rtree_leaf_elm_t **)((long)&rtree_ctx->cache[0].leafkey + uVar5);
  if (prVar6 == prVar4) {
    prVar4 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar2[1]);
  }
  else if ((rtree_leaf_elm_t *)rtree_ctx->l2_cache[0].leafkey == prVar4) {
    prVar3 = rtree_ctx->l2_cache[0].leaf;
    rtree_ctx->l2_cache[0].leafkey = (uintptr_t)prVar6;
    prVar6 = (rtree_leaf_elm_t *)puVar2[1];
    rtree_ctx->l2_cache[0].leaf = prVar6;
    *puVar2 = (ulong)prVar4;
    puVar2[1] = (ulong)prVar3;
    prVar4 = (rtree_leaf_elm_t *)
             ((long)&(prVar3->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
  }
  else {
    prVar8 = rtree_ctx->l2_cache + 1;
    if ((rtree_leaf_elm_t *)rtree_ctx->l2_cache[1].leafkey == prVar4) {
      uVar7 = 0;
      bVar10 = false;
    }
    else {
      uVar5 = 1;
      prVar9 = prVar8;
      do {
        uVar7 = uVar5;
        bVar10 = 6 < uVar7;
        if (uVar7 == 7) goto LAB_01c93f21;
        prVar8 = prVar9 + 1;
        prVar1 = prVar9 + 1;
        uVar5 = uVar7 + 1;
        prVar9 = prVar8;
      } while ((rtree_leaf_elm_t *)prVar1->leafkey != prVar4);
      bVar10 = 6 < uVar7;
    }
    prVar3 = prVar8->leaf;
    prVar8->leafkey = rtree_ctx->l2_cache[uVar7].leafkey;
    prVar8->leaf = rtree_ctx->l2_cache[uVar7].leaf;
    rtree_ctx->l2_cache[uVar7].leafkey = (uintptr_t)prVar6;
    prVar6 = (rtree_leaf_elm_t *)puVar2[1];
    rtree_ctx->l2_cache[uVar7].leaf = prVar6;
    *puVar2 = (ulong)prVar4;
    puVar2[1] = (ulong)prVar3;
    prVar4 = (rtree_leaf_elm_t *)
             ((long)&(prVar3->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
LAB_01c93f21:
    if (bVar10) {
      prVar4 = duckdb_je_rtree_leaf_elm_lookup_hard
                         (tsdn,&duckdb_je_arena_emap_global.rtree,rtree_ctx,(uintptr_t)ptr,true,
                          false);
      prVar6 = extraout_RDX;
    }
  }
  if (((ulong)(prVar4->le_bits).repr & 1) == 0) {
    arena_dalloc_large_no_tcache(tsdn,ptr,(szind_t)prVar6);
  }
  else {
    duckdb_je_arena_dalloc_small(tsdn,ptr);
  }
  return;
}

Assistant:

static inline void
arena_dalloc_no_tcache(tsdn_t *tsdn, void *ptr) {
	assert(ptr != NULL);

	emap_alloc_ctx_t alloc_ctx;
	emap_alloc_ctx_lookup(tsdn, &arena_emap_global, ptr, &alloc_ctx);

	if (config_debug) {
		edata_t *edata = emap_edata_lookup(tsdn, &arena_emap_global,
		    ptr);
		assert(alloc_ctx.szind == edata_szind_get(edata));
		assert(alloc_ctx.szind < SC_NSIZES);
		assert(alloc_ctx.slab == edata_slab_get(edata));
	}

	if (likely(alloc_ctx.slab)) {
		/* Small allocation. */
		arena_dalloc_small(tsdn, ptr);
	} else {
		arena_dalloc_large_no_tcache(tsdn, ptr, alloc_ctx.szind);
	}
}